

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall btMatrixX<float>::setZero(btMatrixX<float> *this)

{
  CProfileSample __profile;
  CProfileSample local_9;
  
  CProfileManager::Start_Profile("storage=0");
  btSetZero<float>((this->m_storage).m_data,(this->m_storage).m_size);
  CProfileSample::~CProfileSample(&local_9);
  return;
}

Assistant:

void setZero()
	{
		{
			BT_PROFILE("storage=0");
			btSetZero(&m_storage[0],m_storage.size());
			//memset(&m_storage[0],0,sizeof(T)*m_storage.size());
			//for (int i=0;i<m_storage.size();i++)
	//			m_storage[i]=0;
		}
	}